

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O0

void __thiscall Fl_Menu_Button::draw(Fl_Menu_Button *this)

{
  uchar uVar1;
  Fl_Boxtype FVar2;
  Fl_Fontsize FVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Color c;
  int Y_00;
  int iVar9;
  int H_00;
  Fl_Widget *pFVar10;
  Fl_Color local_5c;
  Fl_Color local_58;
  Fl_Boxtype local_3c;
  int Y;
  int X;
  int H;
  Fl_Menu_Button *this_local;
  
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  if ((FVar2 != FL_NO_BOX) && (uVar1 = Fl_Widget::type((Fl_Widget *)this), uVar1 == '\0')) {
    FVar3 = Fl_Widget::labelsize((Fl_Widget *)this);
    uVar4 = FVar3 - 3U & 0xfffffffe;
    iVar5 = Fl_Widget::x((Fl_Widget *)this);
    iVar6 = Fl_Widget::w((Fl_Widget *)this);
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar7 = Fl::box_dx(FVar2);
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar8 = Fl::box_dw(FVar2);
    iVar5 = ((((iVar5 + iVar6) - uVar4) - iVar7) - iVar8) + -1;
    iVar6 = Fl_Widget::y((Fl_Widget *)this);
    iVar7 = Fl_Widget::h((Fl_Widget *)this);
    iVar6 = iVar6 + (int)(iVar7 - uVar4) / 2;
    if (pressed_menu_button_ == this) {
      FVar2 = Fl_Widget::box((Fl_Widget *)this);
      local_3c = fl_down(FVar2);
    }
    else {
      local_3c = Fl_Widget::box((Fl_Widget *)this);
    }
    c = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,local_3c,c);
    iVar7 = Fl_Widget::x((Fl_Widget *)this);
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar8 = Fl::box_dx(FVar2);
    Y_00 = Fl_Widget::y((Fl_Widget *)this);
    iVar9 = Fl_Widget::x((Fl_Widget *)this);
    H_00 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_label((Fl_Widget *)this,iVar7 + iVar8,Y_00,(iVar5 - iVar9) + 2,H_00);
    pFVar10 = Fl::focus();
    if (pFVar10 == (Fl_Widget *)this) {
      Fl_Widget::draw_focus((Fl_Widget *)this);
    }
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      local_58 = fl_inactive(0x27);
    }
    else {
      local_58 = 0x27;
    }
    fl_color(local_58);
    fl_line(iVar5 + (int)uVar4 / 2,iVar6 + uVar4,iVar5,iVar6,iVar5 + uVar4,iVar6);
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      local_5c = fl_inactive(0x36);
    }
    else {
      local_5c = 0x36;
    }
    fl_color(local_5c);
    fl_line(iVar5 + uVar4,iVar6,iVar5 + (int)uVar4 / 2,iVar6 + uVar4);
  }
  return;
}

Assistant:

void Fl_Menu_Button::draw() {
  if (!box() || type()) return;
  int H = (labelsize()-3)&-2;
  int X = x()+w()-H-Fl::box_dx(box())-Fl::box_dw(box())-1;
  int Y = y()+(h()-H)/2;
  draw_box(pressed_menu_button_ == this ? fl_down(box()) : box(), color());
  draw_label(x()+Fl::box_dx(box()), y(), X-x()+2, h());
  if (Fl::focus() == this) draw_focus();
  // ** if (box() == FL_FLAT_BOX) return; // for XForms compatibility
  fl_color(active_r() ? FL_DARK3 : fl_inactive(FL_DARK3));
  fl_line(X+H/2, Y+H, X, Y, X+H, Y);
  fl_color(active_r() ? FL_LIGHT3 : fl_inactive(FL_LIGHT3));
  fl_line(X+H, Y, X+H/2, Y+H);
}